

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdcpp.hpp
# Opt level: O2

unique_ptr<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>,_std::default_delete<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>_>_>
 __thiscall
so_5::stdcpp::
make_unique<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>,std::__cxx11::string_const&>
          (stdcpp *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>
  *this_00;
  string sStack_38;
  
  this_00 = (binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>
             *)operator_new(0x28);
  std::__cxx11::string::string((string *)&sStack_38,(string *)args);
  so_5::disp::reuse::
  binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>
  ::binder_for_public_disp_template_t<>(this_00,&sStack_38);
  *(binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>
    **)this = this_00;
  std::__cxx11::string::~string((string *)&sStack_38);
  return (__uniq_ptr_data<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>,_std::default_delete<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>_>,_true,_true>
          )(__uniq_ptr_data<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>,_std::default_delete<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr< T >
make_unique( ARGS && ...args )
	{
		return std::unique_ptr< T >( new T( std::forward<ARGS>(args)... ) );
	}